

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *ctx_local;
  
  for (window = (ImGuiWindow *)ImChunkStream<ImGuiWindowSettings>::begin(&ctx->SettingsWindows);
      window != (ImGuiWindow *)0x0;
      window = (ImGuiWindow *)
               ImChunkStream<ImGuiWindowSettings>::next_chunk
                         (&ctx->SettingsWindows,(ImGuiWindowSettings *)window)) {
    if ((window->Flags & 0x100) != 0) {
      window_00 = ImGui::FindWindowByID(*(ImGuiID *)&window->Name);
      if (window_00 != (ImGuiWindow *)0x0) {
        ApplyWindowSettings(window_00,(ImGuiWindowSettings *)window);
      }
      *(undefined1 *)((long)&window->Flags + 1) = 0;
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->WantApply)
        {
            if (ImGuiWindow* window = ImGui::FindWindowByID(settings->ID))
                ApplyWindowSettings(window, settings);
            settings->WantApply = false;
        }
}